

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  significand_type *psVar1;
  uint uVar2;
  long lVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar4;
  int iVar5;
  wchar_t wVar6;
  int iVar7;
  char cVar8;
  char *pcVar9;
  char *pcVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  ulong uVar13;
  uint uVar14;
  size_t sVar15;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  wchar_t zero;
  significand_type significand;
  int exp;
  digit_grouping<wchar_t> grouping;
  anon_class_40_8_c3c31ef8 write;
  wchar_t local_e4;
  wchar_t local_e0;
  undefined1 local_dc [32];
  undefined1 local_bc [8];
  int iStack_b4;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  int local_98;
  buffer<wchar_t> *local_90;
  decimal_fp<double> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  wchar_t local_68;
  wchar_t wStack_64;
  undefined8 local_60;
  digit_grouping<wchar_t> *local_58;
  digit_grouping<wchar_t> *local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  
  psVar1 = (significand_type *)fp->significand;
  lVar3 = 0x3f;
  if (((ulong)psVar1 | 1) != 0) {
    for (; ((ulong)psVar1 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  wVar11 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
           (uint)(psVar1 < *(significand_type **)
                            (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                            (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] * 8));
  local_dc._8_4_ = 0x30;
  uVar2 = fspecs._4_4_;
  local_dc._4_4_ = uVar2 >> 8 & 0xff;
  local_e0 = wVar11;
  local_dc._20_8_ = psVar1;
  local_80 = (undefined1  [8])fspecs;
  if (wVar11 < L'\0') {
LAB_00177b1b:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  uVar14 = (wVar11 + L'\x01') - (uint)(local_dc._4_4_ == none);
  uVar13 = (ulong)uVar14;
  local_dc._0_4_ = L'.';
  local_78._0_4_ = local_dc._4_4_;
  if ((uVar2 >> 0x11 & 1) != 0) {
    local_dc._12_8_ = specs;
    local_dc._28_4_ = local_dc._4_4_;
    local_90 = out.container;
    local_88 = fp;
    local_dc._0_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
    specs = (basic_format_specs<wchar_t> *)local_dc._12_8_;
    fp = local_88;
    out.container = local_90;
    local_78._0_4_ = local_dc._28_4_;
  }
  iVar5 = fp->exponent;
  local_bc._0_4_ = wVar11 + iVar5;
  wVar12 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00177853:
    iVar5 = wVar11 + iVar5 + -1;
    if ((uVar2 >> 0x14 & 1) == 0) {
      iVar7 = 0;
      if (wVar11 == L'\x01') {
        local_dc._0_4_ = L'\0';
        iVar7 = 0;
      }
    }
    else {
      iVar7 = 0;
      if (0 < wVar12 - wVar11) {
        iVar7 = wVar12 - wVar11;
      }
      uVar13 = (ulong)(uVar14 + iVar7);
    }
    wStack_64 = local_dc._0_4_;
    local_68 = wVar11;
    local_60 = (decimal_fp<double> *)CONCAT44(L'0',iVar7);
    local_58 = (digit_grouping<wchar_t> *)
               (CONCAT44(iVar5,(int)CONCAT71(local_58._1_7_,((uVar2 >> 0x10 & 1) == 0) << 5)) | 0x45
               );
    local_78._8_8_ = psVar1;
    if (0 < specs->width) {
      if ((int)local_bc._0_4_ < L'\x01') {
        iVar5 = 1 - local_bc._0_4_;
      }
      lVar3 = 2;
      if (99 < iVar5) {
        lVar3 = (ulong)(999 < iVar5) + 3;
      }
      sVar15 = uVar13 + (3 - (ulong)(local_dc._0_4_ == L'\0')) + lVar3;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar15,sVar15,(anon_class_40_8_c3c31ef8 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
    }
    bVar4 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
            ::anon_class_40_8_c3c31ef8::operator()
                      ((anon_class_40_8_c3c31ef8 *)local_78,out.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    wVar6 = L'\x10';
    if (L'\0' < wVar12) {
      wVar6 = wVar12;
    }
    if (((int)local_bc._0_4_ < L'\xfffffffd') || (wVar6 < (int)local_bc._0_4_)) goto LAB_00177853;
  }
  if (iVar5 < 0) {
    if ((int)local_bc._0_4_ < L'\x01') {
      wVar6 = -local_bc._0_4_;
      local_bc._4_4_ = wVar6;
      if (SBORROW4(wVar12,wVar6) != wVar12 + local_bc._0_4_ < 0) {
        local_bc._4_4_ = wVar12;
      }
      if (wVar12 < L'\0') {
        local_bc._4_4_ = wVar6;
      }
      if (wVar11 != L'\0') {
        local_bc._4_4_ = wVar6;
      }
      if (wVar11 == L'\0' && local_bc._4_4_ == L'\0') {
        local_e4 = CONCAT31(local_e4._1_3_,(char)((uVar2 & 0x100000) >> 0x14));
        iVar5 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_e4 = CONCAT31(local_e4._1_3_,1);
        iVar5 = 2;
        if ((int)local_bc._4_4_ < L'\0') goto LAB_00177b1b;
      }
      sVar15 = (uint)(iVar5 + local_bc._4_4_) + uVar13;
      local_78._0_8_ = local_dc + 4;
      local_78._8_8_ = local_dc + 8;
      _local_68 = &local_e4;
      local_60 = (decimal_fp<double> *)local_dc;
      local_58 = (digit_grouping<wchar_t> *)(local_bc + 4);
      local_50 = (digit_grouping<wchar_t> *)(local_dc + 0x14);
      local_48 = &local_e0;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                        (out,specs,sVar15,sVar15,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
    }
    wVar6 = L'\0';
    local_e4 = wVar12 - wVar11 & (int)(uVar2 << 0xb) >> 0x1f;
    wVar11 = local_e4;
    if (local_e4 < L'\x01') {
      wVar11 = L'\0';
    }
    local_dc._12_8_ = specs;
    digit_grouping<wchar_t>::digit_grouping
              ((digit_grouping<wchar_t> *)(local_bc + 4),loc,(bool)((byte)(uVar2 >> 0x11) & 1));
    if (local_98 != 0) {
      pcVar9 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
      pcVar10 = pcVar9 + local_b0;
      lVar3 = 0;
      do {
        if (pcVar9 == pcVar10) {
          cVar8 = pcVar10[-1];
          pcVar9 = pcVar10;
        }
        else {
          cVar8 = *pcVar9;
          if ((byte)(cVar8 + 0x81U) < 0x82) goto LAB_00177b3a;
          pcVar9 = pcVar9 + 1;
        }
        wVar6 = wVar6 + cVar8;
        if (local_e0 <= wVar6) goto LAB_00177b3a;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00177b3a:
    sVar15 = uVar13 + (uint)wVar11 + 1 + lVar3;
    local_78._0_8_ = local_dc + 4;
    local_78._8_8_ = local_dc + 0x14;
    _local_68 = &local_e0;
    local_60 = (decimal_fp<double> *)local_bc;
    local_58 = (digit_grouping<wchar_t> *)local_dc;
    local_48 = &local_e4;
    local_40 = (wchar_t *)(local_dc + 8);
    local_50 = (digit_grouping<wchar_t> *)(local_bc + 4);
    bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                      (out,(basic_format_specs<wchar_t> *)local_dc._12_8_,sVar15,sVar15,
                       (anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00177b92;
  }
  uVar13 = (ulong)(iVar5 + uVar14);
  local_e4 = wVar12 - local_bc._0_4_;
  if ((uVar2 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || L'\0' < local_e4) {
      if (local_e4 < L'\x01') goto LAB_00177a16;
    }
    else {
      local_e4 = L'\x01';
    }
    uVar13 = (uint)local_e4 + uVar13 + 1;
  }
LAB_00177a16:
  digit_grouping<wchar_t>::digit_grouping
            ((digit_grouping<wchar_t> *)(local_bc + 4),loc,(bool)((byte)(uVar2 >> 0x11) & 1));
  wVar11 = L'\0';
  if (local_98 != 0) {
    pcVar9 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
    pcVar10 = pcVar9 + local_b0;
    lVar3 = 0;
    do {
      if (pcVar9 == pcVar10) {
        cVar8 = pcVar10[-1];
        pcVar9 = pcVar10;
      }
      else {
        cVar8 = *pcVar9;
        if ((byte)(cVar8 + 0x81U) < 0x82) goto LAB_00177a87;
        pcVar9 = pcVar9 + 1;
      }
      wVar11 = wVar11 + cVar8;
      if (local_e0 <= wVar11) goto LAB_00177a87;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_00177a87:
  local_78._0_8_ = local_dc + 4;
  local_78._8_8_ = local_dc + 0x14;
  _local_68 = &local_e0;
  local_50 = (digit_grouping<wchar_t> *)local_80;
  local_48 = (wchar_t *)local_dc;
  local_40 = &local_e4;
  local_38 = (wchar_t *)(local_dc + 8);
  local_60 = fp;
  local_58 = (digit_grouping<wchar_t> *)(local_bc + 4);
  bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                    (out,specs,uVar13 + lVar3,uVar13 + lVar3,(anon_class_72_9_d68ba176 *)local_78);
LAB_00177b92:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_b4,local_bc._4_4_) != &local_a8) {
    operator_delete((undefined1 *)CONCAT44(iStack_b4,local_bc._4_4_),
                    local_a8._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}